

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

void Cba_ManFree(Cba_Man_t *p)

{
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void **__ptr_02;
  Hash_IntMan_t *__ptr_03;
  Vec_Int_t *pVVar1;
  int *piVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  if (1 < (p->vNtks).nSize) {
    lVar6 = 1;
    do {
      __ptr = (p->vNtks).pArray[lVar6];
      if (*(void **)((long)__ptr + 0x20) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x20));
        *(undefined8 *)((long)__ptr + 0x20) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x18) = 0;
      if (*(void **)((long)__ptr + 0x30) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x30));
        *(undefined8 *)((long)__ptr + 0x30) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x28) = 0;
      if (*(void **)((long)__ptr + 0x40) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x40));
        *(undefined8 *)((long)__ptr + 0x40) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x38) = 0;
      if (*(void **)((long)__ptr + 0x50) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x50));
        *(undefined8 *)((long)__ptr + 0x50) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x48) = 0;
      if (*(void **)((long)__ptr + 0x60) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x60));
        *(undefined8 *)((long)__ptr + 0x60) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x58) = 0;
      if (*(void **)((long)__ptr + 0x70) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x70));
        *(undefined8 *)((long)__ptr + 0x70) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x68) = 0;
      if (*(void **)((long)__ptr + 0x80) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x80));
        *(undefined8 *)((long)__ptr + 0x80) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x78) = 0;
      if (*(void **)((long)__ptr + 0x90) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x90));
        *(undefined8 *)((long)__ptr + 0x90) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x88) = 0;
      if (*(void **)((long)__ptr + 0xa0) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0xa0));
        *(undefined8 *)((long)__ptr + 0xa0) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x98) = 0;
      if (*(void **)((long)__ptr + 0xb0) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0xb0));
        *(undefined8 *)((long)__ptr + 0xb0) = 0;
      }
      *(undefined8 *)((long)__ptr + 0xa8) = 0;
      if (*(void **)((long)__ptr + 0xc0) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0xc0));
        *(undefined8 *)((long)__ptr + 0xc0) = 0;
      }
      *(undefined8 *)((long)__ptr + 0xb8) = 0;
      if (*(void **)((long)__ptr + 0xd0) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0xd0));
        *(undefined8 *)((long)__ptr + 0xd0) = 0;
      }
      *(undefined8 *)((long)__ptr + 200) = 0;
      if (*(void **)((long)__ptr + 0xe0) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0xe0));
        *(undefined8 *)((long)__ptr + 0xe0) = 0;
      }
      *(undefined8 *)((long)__ptr + 0xd8) = 0;
      if (*(void **)((long)__ptr + 0xf0) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0xf0));
        *(undefined8 *)((long)__ptr + 0xf0) = 0;
      }
      *(undefined8 *)((long)__ptr + 0xe8) = 0;
      if (*(void **)((long)__ptr + 0x100) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x100));
        *(undefined8 *)((long)__ptr + 0x100) = 0;
      }
      *(undefined8 *)((long)__ptr + 0xf8) = 0;
      if (*(void **)((long)__ptr + 0x110) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x110));
        *(undefined8 *)((long)__ptr + 0x110) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x108) = 0;
      if (*(void **)((long)__ptr + 0x120) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x120));
        *(undefined8 *)((long)__ptr + 0x120) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x118) = 0;
      if (*(void **)((long)__ptr + 0x130) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x130));
        *(undefined8 *)((long)__ptr + 0x130) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x128) = 0;
      if (*(void **)((long)__ptr + 0x140) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x140));
        *(undefined8 *)((long)__ptr + 0x140) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x138) = 0;
      if (*(void **)((long)__ptr + 0x150) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x150));
        *(undefined8 *)((long)__ptr + 0x150) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x148) = 0;
      if (*(void **)((long)__ptr + 0x160) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x160));
        *(undefined8 *)((long)__ptr + 0x160) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x158) = 0;
      if (*(void **)((long)__ptr + 0x170) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x170));
        *(undefined8 *)((long)__ptr + 0x170) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x168) = 0;
      if (*(void **)((long)__ptr + 0x180) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x180));
        *(undefined8 *)((long)__ptr + 0x180) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x178) = 0;
      if (*(void **)((long)__ptr + 0x198) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x198));
        *(undefined8 *)((long)__ptr + 0x198) = 0;
      }
      *(undefined8 *)((long)__ptr + 400) = 0;
      if (*(void **)((long)__ptr + 0x1a8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x1a8));
        *(undefined8 *)((long)__ptr + 0x1a8) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x1a0) = 0;
      __ptr_00 = *(void **)((long)__ptr + 0x188);
      if (__ptr_00 == (void *)0x0) {
LAB_0032ffda:
        free(__ptr);
      }
      else {
        iVar4 = *(int *)((long)__ptr_00 + 4);
        if (0 < iVar4) {
          lVar5 = 0;
          do {
            __ptr_01 = *(void **)(*(long *)((long)__ptr_00 + 8) + lVar5 * 8);
            if (__ptr_01 != (void *)0x0) {
              if (*(void **)((long)__ptr_01 + 8) != (void *)0x0) {
                free(*(void **)((long)__ptr_01 + 8));
              }
              free(__ptr_01);
              iVar4 = *(int *)((long)__ptr_00 + 4);
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < iVar4);
        }
        if (*(void **)((long)__ptr_00 + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr_00 + 8));
        }
        free(__ptr_00);
        if (__ptr != (void *)0x0) goto LAB_0032ffda;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (p->vNtks).nSize);
  }
  __ptr_02 = (p->vNtks).pArray;
  if (__ptr_02 != (void **)0x0) {
    free(__ptr_02);
    (p->vNtks).pArray = (void **)0x0;
  }
  Abc_NamDeref(p->pStrs);
  Abc_NamDeref(p->pFuns);
  Abc_NamDeref(p->pMods);
  __ptr_03 = p->vHash;
  if (__ptr_03 != (Hash_IntMan_t *)0x0) {
    piVar2 = &__ptr_03->nRefs;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      pVVar1 = __ptr_03->vObjs;
      piVar2 = pVVar1->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
      }
      free(pVVar1);
      pVVar1 = __ptr_03->vTable;
      piVar2 = pVVar1->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
      }
      free(pVVar1);
      free(__ptr_03);
    }
  }
  piVar2 = (p->vNameMap).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vNameMap).pArray = (int *)0x0;
  }
  (p->vNameMap).nCap = 0;
  (p->vNameMap).nSize = 0;
  piVar2 = (p->vUsed).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vUsed).pArray = (int *)0x0;
  }
  (p->vUsed).nCap = 0;
  (p->vUsed).nSize = 0;
  piVar2 = (p->vNameMap2).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vNameMap2).pArray = (int *)0x0;
  }
  (p->vNameMap2).nCap = 0;
  (p->vNameMap2).nSize = 0;
  piVar2 = (p->vUsed2).pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
    (p->vUsed2).pArray = (int *)0x0;
  }
  (p->vUsed2).nCap = 0;
  (p->vUsed2).nSize = 0;
  pcVar3 = (p->vOut).pArray;
  if (pcVar3 != (char *)0x0) {
    free(pcVar3);
    (p->vOut).pArray = (char *)0x0;
  }
  (p->vOut).nCap = 0;
  (p->vOut).nSize = 0;
  pcVar3 = (p->vOut2).pArray;
  if (pcVar3 != (char *)0x0) {
    free(pcVar3);
    (p->vOut2).pArray = (char *)0x0;
  }
  (p->vOut2).nCap = 0;
  (p->vOut2).nSize = 0;
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p->pSpec != (char *)0x0) {
    free(p->pSpec);
  }
  free(p);
  return;
}

Assistant:

static inline void Cba_ManFree( Cba_Man_t * p )
{
    Cba_Ntk_t * pNtk; int i;
    Cba_ManForEachNtk( p, pNtk, i )
        Cba_NtkFree( pNtk );
    ABC_FREE( p->vNtks.pArray );
    Abc_NamDeref( p->pStrs );
    Abc_NamDeref( p->pFuns );
    Abc_NamDeref( p->pMods );
    Hash_IntManDeref( p->vHash );
    Vec_IntErase( &p->vNameMap );
    Vec_IntErase( &p->vUsed );
    Vec_IntErase( &p->vNameMap2 );
    Vec_IntErase( &p->vUsed2 );
    Vec_StrErase( &p->vOut );
    Vec_StrErase( &p->vOut2 );
    ABC_FREE( p->pName );
    ABC_FREE( p->pSpec );
    ABC_FREE( p );
}